

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_fwd_txfm.c
# Opt level: O0

void av1_fwht4x4_c(int16_t *input,tran_low_t *output,int stride)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  tran_low_t *op;
  tran_low_t *ip;
  int16_t *ip_pass0;
  tran_high_t e1;
  tran_high_t d1;
  tran_high_t c1;
  tran_high_t b1;
  tran_high_t a1;
  int i;
  int stride_local;
  tran_low_t *output_local;
  int16_t *input_local;
  
  op = output;
  ip_pass0 = input;
  for (i = 0; i < 4; i = i + 1) {
    lVar3 = (long)ip_pass0[stride] + (long)*ip_pass0;
    lVar4 = (long)ip_pass0[stride * 3] - (long)ip_pass0[stride << 1];
    iVar1 = (int)(lVar3 - lVar4 >> 1);
    iVar2 = iVar1 - ip_pass0[stride];
    iVar1 = iVar1 - ip_pass0[stride << 1];
    *op = (int)lVar3 - iVar1;
    op[1] = iVar1;
    op[2] = iVar2 + (int)lVar4;
    op[3] = iVar2;
    ip_pass0 = ip_pass0 + 1;
    op = op + 4;
  }
  op = output;
  ip = output;
  for (i = 0; i < 4; i = i + 1) {
    lVar3 = (long)ip[4] + (long)*ip;
    lVar4 = (long)ip[0xc] - (long)ip[8];
    iVar1 = (int)(lVar3 - lVar4 >> 1);
    iVar2 = iVar1 - ip[4];
    iVar1 = iVar1 - ip[8];
    *op = ((int)lVar3 - iVar1) * 4;
    op[4] = iVar1 * 4;
    op[8] = (iVar2 + (int)lVar4) * 4;
    op[0xc] = iVar2 * 4;
    ip = ip + 1;
    op = op + 1;
  }
  return;
}

Assistant:

void av1_fwht4x4_c(const int16_t *input, tran_low_t *output, int stride) {
  int i;
  tran_high_t a1, b1, c1, d1, e1;
  const int16_t *ip_pass0 = input;
  const tran_low_t *ip = NULL;
  tran_low_t *op = output;

  for (i = 0; i < 4; i++) {
    a1 = ip_pass0[0 * stride];
    b1 = ip_pass0[1 * stride];
    c1 = ip_pass0[2 * stride];
    d1 = ip_pass0[3 * stride];

    a1 += b1;
    d1 = d1 - c1;
    e1 = (a1 - d1) >> 1;
    b1 = e1 - b1;
    c1 = e1 - c1;
    a1 -= c1;
    d1 += b1;
    op[0] = (tran_low_t)a1;
    op[1] = (tran_low_t)c1;
    op[2] = (tran_low_t)d1;
    op[3] = (tran_low_t)b1;

    ip_pass0++;
    op += 4;
  }
  ip = output;
  op = output;

  for (i = 0; i < 4; i++) {
    a1 = ip[4 * 0];
    b1 = ip[4 * 1];
    c1 = ip[4 * 2];
    d1 = ip[4 * 3];

    a1 += b1;
    d1 -= c1;
    e1 = (a1 - d1) >> 1;
    b1 = e1 - b1;
    c1 = e1 - c1;
    a1 -= c1;
    d1 += b1;
    op[4 * 0] = (tran_low_t)(a1 * UNIT_QUANT_FACTOR);
    op[4 * 1] = (tran_low_t)(c1 * UNIT_QUANT_FACTOR);
    op[4 * 2] = (tran_low_t)(d1 * UNIT_QUANT_FACTOR);
    op[4 * 3] = (tran_low_t)(b1 * UNIT_QUANT_FACTOR);

    ip++;
    op++;
  }
}